

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O1

Float __thiscall
pbrt::TrowbridgeReitzDistribution::Lambda(TrowbridgeReitzDistribution *this,Vector3f *w)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  
  fVar13 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar13 = fVar13 * fVar13;
  auVar11 = ZEXT816(0) << 0x40;
  auVar5 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar13)),auVar11);
  fVar10 = auVar5._0_4_;
  fVar13 = fVar10 / fVar13;
  if (ABS(fVar13) != INFINITY) {
    uVar1 = (w->super_Tuple3<pbrt::Vector3,_float>).x;
    uVar3 = (w->super_Tuple3<pbrt::Vector3,_float>).y;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      auVar5 = vsqrtss_avx(auVar5,auVar5);
      fVar10 = auVar5._0_4_;
    }
    fVar8 = 1.0;
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      auVar11._0_4_ = (float)uVar1 / fVar10;
      auVar11._4_4_ = uVar3;
      auVar11._8_8_ = 0;
      auVar5 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
      uVar6 = vcmpss_avx512f(auVar11,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar7 = (bool)((byte)uVar6 & 1);
      fVar8 = (float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar5._0_4_);
    }
    fVar8 = fVar8 * this->alpha_x;
    uVar2 = (w->super_Tuple3<pbrt::Vector3,_float>).x;
    uVar4 = (w->super_Tuple3<pbrt::Vector3,_float>).y;
    auVar14._4_4_ = uVar4;
    auVar14._0_4_ = uVar2;
    auVar14._8_8_ = 0;
    fVar10 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar5 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar10 * fVar10)),ZEXT816(0) << 0x40);
    if (auVar5._0_4_ < 0.0) {
      fVar10 = sqrtf(auVar5._0_4_);
    }
    else {
      auVar5 = vsqrtss_avx(auVar5,auVar5);
      fVar10 = auVar5._0_4_;
    }
    fVar9 = 0.0;
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      auVar5 = vmovshdup_avx(auVar14);
      auVar12._0_4_ = auVar5._0_4_ / fVar10;
      auVar12._4_12_ = auVar5._4_12_;
      auVar5 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar12);
      uVar6 = vcmpss_avx512f(auVar12,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar7 = (bool)((byte)uVar6 & 1);
      fVar9 = (float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar5._0_4_);
    }
    fVar9 = fVar9 * this->alpha_y;
    auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar13),ZEXT416((uint)(fVar8 * fVar8 + fVar9 * fVar9)),
                             ZEXT416(0x3f800000));
    if (auVar5._0_4_ < 0.0) {
      fVar13 = sqrtf(auVar5._0_4_);
    }
    else {
      auVar5 = vsqrtss_avx(auVar5,auVar5);
      fVar13 = auVar5._0_4_;
    }
    auVar11 = ZEXT416((uint)((fVar13 + -1.0) * 0.5));
  }
  return auVar11._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Lambda(const Vector3f &w) const {
        Float tan2Theta = Tan2Theta(w);
        if (IsInf(tan2Theta))
            return 0.;
        // Compute _alpha2_ for direction _w_
        Float alpha2 = Sqr(CosPhi(w) * alpha_x) + Sqr(SinPhi(w) * alpha_y);

        return (-1 + std::sqrt(1 + alpha2 * tan2Theta)) / 2;
    }